

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysAllocService.cpp
# Opt level: O0

void * anon_unknown.dwarf_47f904::cali_realloc_wrapper(void *ptr,size_t size)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  ChannelBody *pCVar4;
  void *ptr_00;
  int *piVar5;
  undefined1 local_90 [8];
  Caliper c_1;
  ChannelList *p_1;
  int saved_errno;
  void *ret;
  undefined1 local_48 [8];
  Caliper c;
  ChannelList *p;
  _func_void_ptr_void_ptr_size_t *orig_realloc;
  size_t size_local;
  void *ptr_local;
  
  orig_realloc = (_func_void_ptr_void_ptr_size_t *)size;
  size_local = (size_t)ptr;
  pcVar3 = (code *)gotcha_get_wrappee((anonymous_namespace)::orig_realloc_handle);
  c.m_is_signal = (anonymous_namespace)::sysalloc_channels._0_1_;
  c._25_7_ = (anonymous_namespace)::sysalloc_channels._1_7_;
  for (; c._24_8_ != 0; c._24_8_ = *(undefined8 *)(c._24_8_ + 0x10)) {
    cali::Caliper::sigsafe_instance();
    bVar2 = cali::Caliper::operator_cast_to_bool((Caliper *)local_48);
    if ((bVar2) && (bVar2 = cali::Channel::is_active((Channel *)c._24_8_), bVar2)) {
      pCVar4 = cali::Channel::body((Channel *)c._24_8_);
      cali::Caliper::memory_region_end((Caliper *)local_48,pCVar4,(void *)size_local);
    }
    cali::Caliper::~Caliper((Caliper *)local_48);
  }
  ptr_00 = (void *)(*pcVar3)(size_local,orig_realloc);
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  c_1.m_is_signal = (anonymous_namespace)::sysalloc_channels._0_1_;
  c_1._25_7_ = (anonymous_namespace)::sysalloc_channels._1_7_;
  for (; c_1._24_8_ != 0; c_1._24_8_ = *(undefined8 *)(c_1._24_8_ + 0x10)) {
    cali::Caliper::sigsafe_instance();
    bVar2 = cali::Caliper::operator_cast_to_bool((Caliper *)local_90);
    if ((bVar2) && (bVar2 = cali::Channel::is_active((Channel *)c_1._24_8_), bVar2)) {
      pCVar4 = cali::Channel::body((Channel *)c_1._24_8_);
      cali::Caliper::memory_region_begin
                ((Caliper *)local_90,pCVar4,ptr_00,"realloc",1,1,(size_t *)&orig_realloc,0,
                 (Attribute *)0x0,(Variant *)0x0);
    }
    cali::Caliper::~Caliper((Caliper *)local_90);
  }
  piVar5 = __errno_location();
  *piVar5 = iVar1;
  return ptr_00;
}

Assistant:

void* cali_realloc_wrapper(void* ptr, size_t size)
{
    decltype(&std::realloc) orig_realloc =
        reinterpret_cast<decltype(&std::realloc)>(gotcha_get_wrappee(orig_realloc_handle));

    for (ChannelList* p = sysalloc_channels; p; p = p->next) {
        Caliper c = Caliper::sigsafe_instance();

        if (c && p->channel.is_active())
            c.memory_region_end(p->channel.body(), ptr);
    }

    void* ret = (*orig_realloc)(ptr, size);

    int saved_errno = errno;

    for (ChannelList* p = sysalloc_channels; p; p = p->next) {
        Caliper c = Caliper::sigsafe_instance();

        if (c && p->channel.is_active())
            c.memory_region_begin(p->channel.body(), ret, "realloc", 1, 1, &size);
    }

    errno = saved_errno;

    return ret;
}